

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expFuncEndianness(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  _Alloc_hider _Var1;
  StringLiteral local_a8;
  string local_88;
  string local_68;
  undefined4 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = 0;
  local_40 = 0;
  local_48 = 3;
  local_38 = &local_28;
  if (g_fileManager->endianness == Big) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"big","");
    StringLiteral::StringLiteral(&local_a8,&local_88);
    __return_storage_ptr__->type = String;
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->strValue,local_a8._value._M_dataplus._M_p,
               local_a8._value._M_dataplus._M_p + local_a8._value._M_string_length);
    (__return_storage_ptr__->field_1).intValue = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._value._M_dataplus._M_p != &local_a8._value.field_2) {
      operator_delete(local_a8._value._M_dataplus._M_p,
                      local_a8._value.field_2._M_allocated_capacity + 1);
    }
    _Var1._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_0012d0ea;
  }
  else {
    if (g_fileManager->endianness != Little) {
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
      (__return_storage_ptr__->strValue)._value._M_string_length = 0;
      (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->type = Invalid;
      (__return_storage_ptr__->field_1).intValue = 0;
      goto LAB_0012d0ea;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"little","");
    StringLiteral::StringLiteral(&local_a8,&local_68);
    __return_storage_ptr__->type = String;
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->strValue,local_a8._value._M_dataplus._M_p,
               local_a8._value._M_dataplus._M_p + local_a8._value._M_string_length);
    (__return_storage_ptr__->field_1).intValue = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._value._M_dataplus._M_p != &local_a8._value.field_2) {
      operator_delete(local_a8._value._M_dataplus._M_p,
                      local_a8._value.field_2._M_allocated_capacity + 1);
    }
    local_88.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    _Var1._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0012d0ea;
  }
  operator_delete(_Var1._M_p,local_88.field_2._M_allocated_capacity + 1);
LAB_0012d0ea:
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncEndianness(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	result.type = ExpressionValueType::String;

	switch (g_fileManager->getEndianness())
	{
	case Endianness::Little:
		return ExpressionValue(StringLiteral("little"));
	case Endianness::Big:
		return ExpressionValue(StringLiteral("big"));
	}

	return ExpressionValue();
}